

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

int Exa3_ManEval(Exa3_Man_t_conflict *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  word *pwVar5;
  word *pIn2;
  int iVarStart;
  word *pFanins [6];
  int local_20;
  int local_1c;
  int iMint;
  int j;
  int k;
  int i;
  Exa3_Man_t_conflict *p_local;
  
  for (j = p->nVars; j < p->nObjs; j = j + 1) {
    iVar1 = p->LutMask;
    iVar2 = p->nVars;
    for (iMint = 0; iMint < p->nLutSize; iMint = iMint + 1) {
      iVar3 = Exa3_ManFindFanin(p,j,iMint);
      pwVar4 = Exa3_ManTruth(p,iVar3);
      *(word **)(&stack0xffffffffffffffa8 + (long)iMint * 8) = pwVar4;
    }
    pwVar4 = Exa3_ManTruth(p,j);
    Abc_TtConst0(pwVar4,p->nWords);
    for (iMint = 1; iMint <= p->LutMask; iMint = iMint + 1) {
      iVar3 = sat_solver_var_value(p->pSat,iVar1 * (j - iVar2) + iMint);
      if (iVar3 != 0) {
        pwVar4 = Exa3_ManTruth(p,p->nObjs);
        Abc_TtConst1(pwVar4,p->nWords);
        for (local_1c = 0; local_1c < p->nLutSize; local_1c = local_1c + 1) {
          pwVar4 = Exa3_ManTruth(p,p->nObjs);
          pwVar5 = Exa3_ManTruth(p,p->nObjs);
          Abc_TtAndCompl(pwVar4,pwVar5,0,*(word **)(&stack0xffffffffffffffa8 + (long)local_1c * 8),
                         (uint)(((iMint >> ((byte)local_1c & 0x1f) & 1U) != 0 ^ 0xffU) & 1),
                         p->nWords);
        }
        pwVar4 = Exa3_ManTruth(p,j);
        pwVar5 = Exa3_ManTruth(p,j);
        pIn2 = Exa3_ManTruth(p,p->nObjs);
        Abc_TtOr(pwVar4,pwVar5,pIn2,p->nWords);
      }
    }
  }
  if ((Exa3_ManEval::Flag == 0) || (p->nVars < 6)) {
    pwVar4 = Exa3_ManTruth(p,p->nObjs + -1);
    local_20 = Abc_TtFindFirstDiffBit(pwVar4,p->pTruth,p->nVars);
  }
  else {
    pwVar4 = Exa3_ManTruth(p,p->nObjs + -1);
    local_20 = Abc_TtFindLastDiffBit(pwVar4,p->pTruth,p->nVars);
  }
  if (1 << ((byte)p->nVars & 0x1f) <= local_20) {
    __assert_fail("iMint < (1 << p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x451,"int Exa3_ManEval(Exa3_Man_t *)");
  }
  return local_20;
}

Assistant:

static inline int Exa3_ManEval( Exa3_Man_t * p )
{
    static int Flag = 0;
    int i, k, j, iMint; word * pFanins[6];
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        int iVarStart = 1 + p->LutMask*(i - p->nVars);
        for ( k = 0; k < p->nLutSize; k++ )
            pFanins[k] = Exa3_ManTruth( p, Exa3_ManFindFanin(p, i, k) );
        Abc_TtConst0( Exa3_ManTruth(p, i),        p->nWords );
        for ( k = 1; k <= p->LutMask; k++ )
        {
            if ( !sat_solver_var_value(p->pSat, iVarStart+k-1) )
                continue;
//            Abc_TtAndCompl( Exa3_ManTruth(p, p->nObjs), pFanins[0], !(k&1), pFanins[1], !(k>>1), p->nWords );
            Abc_TtConst1( Exa3_ManTruth(p, p->nObjs), p->nWords );
            for ( j = 0; j < p->nLutSize; j++ )
                Abc_TtAndCompl( Exa3_ManTruth(p, p->nObjs), Exa3_ManTruth(p, p->nObjs), 0, pFanins[j], !((k >> j) & 1), p->nWords );
            Abc_TtOr( Exa3_ManTruth(p, i), Exa3_ManTruth(p, i), Exa3_ManTruth(p, p->nObjs), p->nWords );
        }
    }
    if ( Flag && p->nVars >= 6 )
        iMint = Abc_TtFindLastDiffBit( Exa3_ManTruth(p, p->nObjs-1), p->pTruth, p->nVars );
    else
        iMint = Abc_TtFindFirstDiffBit( Exa3_ManTruth(p, p->nObjs-1), p->pTruth, p->nVars );
    //Flag ^= 1;
    assert( iMint < (1 << p->nVars) );
    return iMint;
}